

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_packing.cpp
# Opt level: O1

tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
* packing::overloadAndRemove
            (tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
             *__return_storage_ptr__,
            vector<ProtoPalette,_std::allocator<ProtoPalette>_> *protoPalettes)

{
  long *plVar1;
  value_type_conflict2 vVar2;
  _Bit_type *p_Var3;
  ProtoPalAttrs *pPVar4;
  long *plVar5;
  _Elt_pointer pPVar6;
  unsigned_long uVar7;
  const_iterator __position;
  FILE *pFVar8;
  ProtoPalAttrs *pPVar9;
  pointer poVar10;
  pointer pAVar11;
  pointer pAVar12;
  pointer puVar13;
  tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
  *ptVar14;
  AssignedProtos *pAVar15;
  const_iterator cVar16;
  bool bVar17;
  bool bVar18;
  size_t sVar19;
  unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
  *puVar20;
  ushort *puVar21;
  const_iterator pvVar22;
  __normal_iterator<const_std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>
  _Var23;
  pointer poVar24;
  const_iterator pvVar25;
  size_type sVar26;
  AssignedProtos *pAVar27;
  unsigned_long uVar28;
  uint uVar29;
  ulong uVar30;
  AssignedProtos *pal;
  ProtoPalette *pPVar31;
  __normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>
  _Var32;
  _Optional_payload_base<packing::ProtoPalAttrs> *p_Var33;
  _Optional_payload_base<packing::ProtoPalAttrs> *p_Var34;
  _Elt_pointer pPVar35;
  AssignedProtos *__range3_1;
  __normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>
  _Var36;
  __normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>
  _Var37;
  AssignedProtos *pAVar38;
  iterator __position_00;
  _Hash_node_base *p_Var39;
  ulong uVar40;
  long *plVar41;
  long *plVar42;
  __normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>
  _Var43;
  vector<ProtoPalette,_std::allocator<ProtoPalette>_> *in_R9;
  value_type_conflict2 *pvVar44;
  AssignedProtos *pAVar45;
  __normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>
  _Var46;
  ProtoPalAttrs *pPVar47;
  ProtoPalAttrs *__args;
  _Optional_payload_base<packing::ProtoPalAttrs> *p_Var48;
  _Optional_payload_base<packing::ProtoPalAttrs> *p_Var49;
  ProtoPalAttrs *attrs;
  __normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>
  _Var50;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  *pIVar51;
  pointer poVar52;
  size_t to;
  long lVar53;
  pointer poVar54;
  pointer poVar55;
  undefined1 auVar56 [16];
  double dVar58;
  undefined1 auVar57 [16];
  undefined1 auVar59 [16];
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it1;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it1_00;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it1_01;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it1_02;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it1_03;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it1_04;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it1_05;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it1_06;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it2;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it2_00;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it2_01;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it2_02;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it2_03;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it2_04;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it2_05;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  __it2_06;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  iter;
  _Bit_iterator _Var60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> members;
  anon_class_8_1_7660daf7 efficiency;
  DefaultInitVec<size_t> mappings;
  DefaultInitVec<size_t> sortedProtoPalIDs;
  queue<packing::ProtoPalAttrs,_std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>_>
  queue;
  vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_> local_198;
  Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
  *local_180;
  _Optional_payload_base<packing::ProtoPalAttrs> *local_178;
  double dStack_170;
  _Node_iterator_base<unsigned_short,_false> local_160;
  AssignedProtos *local_158;
  AssignedProtos *local_150;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_148;
  vector<bool,_std::allocator<bool>_> local_130;
  AssignedProtos *local_108;
  double dStack_100;
  _Deque_base<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_> local_f8;
  vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_a8;
  _Deque_base<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_> local_90;
  tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
  *local_40;
  _Node_iterator_base<unsigned_short,_false> local_38;
  
  Options::verbosePrint
            (&options,'\x02',"Paginating palettes using \"overload-and-remove\" strategy...\n");
  local_180 = (Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
               *)protoPalettes;
  std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
  ::vector(&local_a8,
           (long)(protoPalettes->super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(protoPalettes->super__Vector_base<ProtoPalette,_std::allocator<ProtoPalette>_>).
                 _M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_90);
  if (local_a8.
      super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_a8.
      super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_a8.
    super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_a8.
         super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  local_90._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  if ((local_180->_iter)._M_current !=
      (optional<packing::ProtoPalAttrs> *)
      (((_Optional_base<packing::ProtoPalAttrs,_false,_false> *)&local_180->_array)->_M_payload).
      super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
      super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload._M_value.protoPalIndex) {
    do {
      uVar40 = (long)local_a8.
                     super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_a8.
                     super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
      cVar16._M_current =
           local_a8.
           super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      while (__position._M_current = cVar16._M_current, 0 < (long)uVar40) {
        uVar30 = uVar40 >> 1;
        uVar40 = ~uVar30 + uVar40;
        cVar16._M_current = __position._M_current + uVar30 + 1;
        if (local_90._M_impl.super__Deque_impl_data._M_map <=
            (_Map_pointer)__position._M_current[uVar30]) {
          uVar40 = uVar30;
          cVar16._M_current = __position._M_current;
        }
      }
      std::
      vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::insert(&local_a8,__position,(value_type_conflict3 *)&local_90);
      local_90._M_impl.super__Deque_impl_data._M_map =
           (_Map_pointer)((long)local_90._M_impl.super__Deque_impl_data._M_map + 1);
    } while (local_90._M_impl.super__Deque_impl_data._M_map <
             (_Map_pointer)
             ((long)((long)(local_180->_iter)._M_current -
                    (((_Optional_base<packing::ProtoPalAttrs,_false,_false> *)&local_180->_array)->
                    _M_payload).super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
                    super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload._M_value.
                    protoPalIndex) >> 3));
  }
  local_f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::deque<packing::ProtoPalAttrs,std::allocator<packing::ProtoPalAttrs>>::
  _M_range_initialize<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,default_init_allocator<unsigned_long,std::allocator<unsigned_long>>>>>
            ((deque<packing::ProtoPalAttrs,std::allocator<packing::ProtoPalAttrs>> *)&local_f8,
             local_a8.
             super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_a8.
             super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  local_40 = __return_storage_ptr__;
  std::_Deque_base<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>::_Deque_base
            (&local_90,&local_f8);
  std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>::~deque
            ((deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_> *)&local_f8);
  local_198.super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while (pPVar35 = local_90._M_impl.super__Deque_impl_data._M_start._M_cur,
        pAVar11 = local_198.
                  super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
        local_90._M_impl.super__Deque_impl_data._M_finish._M_cur !=
        local_90._M_impl.super__Deque_impl_data._M_start._M_cur) {
    Options::verbosePrint
              (&options,'\x04',"Handling proto-pal %zu\n",
               (local_90._M_impl.super__Deque_impl_data._M_start._M_cur)->protoPalIndex);
    pAVar12 = local_198.
              super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pAVar11 = local_198.
              super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pPVar31 = (ProtoPalette *)
              ((((_Optional_base<packing::ProtoPalAttrs,_false,_false> *)&local_180->_array)->
               _M_payload).super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
               super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload._M_value.
               protoPalIndex + pPVar35->protoPalIndex * 8);
    sVar19 = ProtoPalette::size(pPVar31);
    local_158 = (AssignedProtos *)((long)pAVar12 - (long)pAVar11 >> 5);
    pAVar45 = (AssignedProtos *)
              ((long)local_198.
                     super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_198.
                     super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    auVar56._8_4_ = (int)(sVar19 >> 0x20);
    auVar56._0_8_ = sVar19;
    auVar56._12_4_ = 0x45300000;
    dVar58 = auVar56._8_8_ - 1.9342813113834067e+25;
    if (local_198.
        super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_198.
        super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      local_178 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                  (dVar58 + ((double)CONCAT44(0x43300000,(int)sVar19) - 4503599627370496.0));
      lVar53 = 0;
      pAVar38 = (AssignedProtos *)0x0;
      dStack_170 = dVar58;
      do {
        p_Var3 = (pPVar35->bannedPages).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        if (pAVar38 < (AssignedProtos *)
                      ((ulong)(pPVar35->bannedPages).super__Bvector_base<std::allocator<bool>_>.
                              _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                              _M_offset +
                      ((long)(pPVar35->bannedPages).super__Bvector_base<std::allocator<bool>_>.
                             _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                             _M_p - (long)p_Var3) * 8)) {
          pAVar27 = (AssignedProtos *)((long)&pAVar38[1]._protoPals + 7);
          if (-1 < (long)pAVar38) {
            pAVar27 = pAVar38;
          }
          if ((p_Var3[((long)pAVar27 >> 6) +
                      (ulong)(((ulong)pAVar38 & 0x800000000000003f) < 0x8000000000000001) +
                      0xffffffffffffffff] >> ((ulong)pAVar38 & 0x3f) & 1) == 0) goto LAB_001073ee;
        }
        else {
LAB_001073ee:
          dVar58 = AssignedProtos::relSizeOf
                             ((AssignedProtos *)
                              ((long)&(local_198.
                                       super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_assigned +
                              lVar53),pPVar31);
          in_R9 = (vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)ProtoPalette::size(pPVar31)
          ;
          Options::verbosePrint
                    (&options,'\x04',"%zu/%zu: Rel size: %f (size = %zu)\n",dVar58,
                     (undefined1 *)
                     ((long)&(pAVar38->_assigned).
                             super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 1),pAVar45);
          dVar58 = AssignedProtos::relSizeOf
                             ((AssignedProtos *)
                              ((long)&(local_198.
                                       super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_assigned +
                              lVar53),pPVar31);
          if (dVar58 < (double)local_178) {
            local_158 = pAVar38;
          }
        }
        pAVar38 = (AssignedProtos *)
                  ((long)&(pAVar38->_assigned).
                          super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 1);
        pAVar45 = (AssignedProtos *)
                  ((long)local_198.
                         super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_198.
                         super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5);
        lVar53 = lVar53 + 0x20;
      } while (pAVar38 < pAVar45);
    }
    if (local_158 == pAVar45) {
      std::vector<packing::AssignedProtos,std::allocator<packing::AssignedProtos>>::
      emplace_back<std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&,packing::ProtoPalAttrs_const>
                ((vector<packing::AssignedProtos,std::allocator<packing::AssignedProtos>> *)
                 &local_198,(vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)local_180,pPVar35
                );
    }
    else {
      pAVar45 = (AssignedProtos *)
                ((long)&(local_198.
                         super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_assigned +
                (long)local_158 * 0x20);
      AssignedProtos::assign<packing::ProtoPalAttrs_const>(pAVar45,pPVar35);
      do {
        puVar20 = AssignedProtos::uniqueColors(pAVar45);
        if ((puVar20->_M_h)._M_element_count <=
            (ulong)(byte)(options.nbColorsPerPal - options.hasTransparentPixels)) break;
        puVar20 = AssignedProtos::uniqueColors(pAVar45);
        _Var43._M_current = (optional<packing::ProtoPalAttrs> *)(puVar20->_M_h)._M_element_count;
        in_R9 = (vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)
                (ulong)(byte)(options.nbColorsPerPal - options.hasTransparentPixels);
        pAVar38 = local_158;
        Options::verbosePrint(&options,'\x04',"Palette %zu is overloaded! (%zu > %u)\n");
        p_Var33 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                  (pAVar45->_assigned).
                  super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (_Var37._M_current =
                  (pAVar45->_assigned).
                  super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
            ((_Optional_payload_base<packing::ProtoPalAttrs> *)_Var37._M_current != p_Var33 &&
            (*(bool *)((_Storage<packing::ProtoPalAttrs,_false> *)
                       &(_Var37._M_current)->
                        super__Optional_base<packing::ProtoPalAttrs,_false,_false> + 1) == false));
            _Var37._M_current = _Var37._M_current + 1) {
        }
        local_f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)&local_130;
        local_f8._M_impl.super__Deque_impl_data._M_map_size = (size_t)local_180;
        _Var50._M_current = _Var37._M_current;
        _Var36._M_current = _Var37._M_current;
        local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)pAVar45;
        if ((_Optional_payload_base<packing::ProtoPalAttrs> *)_Var37._M_current != p_Var33) {
          do {
            p_Var49 = (_Optional_payload_base<packing::ProtoPalAttrs> *)_Var36._M_current + 1;
            if (p_Var49 == p_Var33) break;
            p_Var34 = (_Optional_payload_base<packing::ProtoPalAttrs> *)_Var36._M_current + 1;
            _Var36._M_current = (optional<packing::ProtoPalAttrs> *)p_Var49;
          } while (p_Var34->_M_engaged == false);
          if (p_Var49 != p_Var33) {
            __it1._iter._M_current = _Var37._M_current;
            __it1._array = (remove_const_t<decltype(_assigned)> *)p_Var49;
            __it2._iter._M_current = _Var43._M_current;
            __it2._array = &pAVar38->_assigned;
            bVar17 = __gnu_cxx::__ops::
                     _Iter_comp_iter<packing::overloadAndRemove(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                     ::operator()(&local_f8,__it1,__it2);
            _Var36._M_current = (optional<packing::ProtoPalAttrs> *)p_Var49;
            if (!bVar17) {
              _Var50._M_current = (optional<packing::ProtoPalAttrs> *)p_Var49;
              _Var36._M_current = _Var37._M_current;
            }
            do {
              _Var32._M_current = (optional<packing::ProtoPalAttrs> *)(p_Var49 + 1);
              if ((_Optional_payload_base<packing::ProtoPalAttrs> *)_Var32._M_current ==
                  (_Optional_payload_base<packing::ProtoPalAttrs> *)
                  (pAVar45->_assigned).
                  super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) break;
              p_Var34 = p_Var49 + 1;
              p_Var49 = (_Optional_payload_base<packing::ProtoPalAttrs> *)_Var32._M_current;
            } while (p_Var34->_M_engaged == false);
            _Var37._M_current = _Var36._M_current;
            pAVar27 = pAVar45;
            pAVar15 = pAVar45;
            if ((_Optional_payload_base<packing::ProtoPalAttrs> *)_Var32._M_current != p_Var33) {
              do {
                local_108 = pAVar15;
                local_150 = pAVar27;
                local_178 = p_Var33;
                _Var46._M_current = _Var32._M_current;
                do {
                  p_Var33 = (_Optional_payload_base<packing::ProtoPalAttrs> *)_Var46._M_current;
                  _Var46._M_current = (optional<packing::ProtoPalAttrs> *)(p_Var33 + 1);
                  if ((_Optional_payload_base<packing::ProtoPalAttrs> *)_Var46._M_current ==
                      (_Optional_payload_base<packing::ProtoPalAttrs> *)
                      (pAVar45->_assigned).
                      super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) break;
                } while (p_Var33[1]._M_engaged == false);
                _Var37._M_current = _Var36._M_current;
                if ((_Optional_payload_base<packing::ProtoPalAttrs> *)_Var46._M_current == local_178
                   ) {
                  __it1_05._iter._M_current = _Var36._M_current;
                  __it1_05._array = (remove_const_t<decltype(_assigned)> *)_Var32._M_current;
                  __it2_05._iter._M_current = _Var43._M_current;
                  __it2_05._array = &pAVar38->_assigned;
                  bVar17 = __gnu_cxx::__ops::
                           _Iter_comp_iter<packing::overloadAndRemove(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                           ::operator()(&local_f8,__it1_05,__it2_05);
                  _Var37._M_current = _Var32._M_current;
                  if ((!bVar17) &&
                     (__it1_06._iter._M_current = _Var50._M_current,
                     __it1_06._array = (remove_const_t<decltype(_assigned)> *)_Var32._M_current,
                     __it2_06._iter._M_current = _Var43._M_current,
                     __it2_06._array = &pAVar38->_assigned,
                     bVar17 = __gnu_cxx::__ops::
                              _Iter_comp_iter<packing::overloadAndRemove(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                              ::operator()(&local_f8,__it1_06,__it2_06),
                     _Var37._M_current = _Var36._M_current, !bVar17)) {
                    _Var50._M_current = _Var32._M_current;
                  }
                  break;
                }
                __it1_00._iter._M_current = _Var32._M_current;
                __it1_00._array = (remove_const_t<decltype(_assigned)> *)_Var46._M_current;
                __it2_00._iter._M_current = _Var43._M_current;
                __it2_00._array = &pAVar38->_assigned;
                bVar17 = __gnu_cxx::__ops::
                         _Iter_comp_iter<packing::overloadAndRemove(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                         ::operator()(&local_f8,__it1_00,__it2_00);
                if (bVar17) {
                  __it1_01._iter._M_current = _Var36._M_current;
                  __it1_01._array = (remove_const_t<decltype(_assigned)> *)_Var46._M_current;
                  __it2_01._iter._M_current = _Var43._M_current;
                  __it2_01._array = &pAVar38->_assigned;
                  bVar17 = __gnu_cxx::__ops::
                           _Iter_comp_iter<packing::overloadAndRemove(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                           ::operator()(&local_f8,__it1_01,__it2_01);
                  __it1_02._iter._M_current = _Var50._M_current;
                  __it1_02._array = (remove_const_t<decltype(_assigned)> *)_Var32._M_current;
                  __it2_02._iter._M_current = _Var43._M_current;
                  __it2_02._array = &pAVar38->_assigned;
                  bVar18 = __gnu_cxx::__ops::
                           _Iter_comp_iter<packing::overloadAndRemove(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                           ::operator()(&local_f8,__it1_02,__it2_02);
                  if (bVar17) {
                    local_150 = pAVar45;
                    _Var37._M_current = _Var46._M_current;
                  }
                  if (!bVar18) {
                    _Var50._M_current = _Var32._M_current;
                    local_108 = pAVar45;
                  }
                }
                else {
                  __it1_03._iter._M_current = _Var36._M_current;
                  __it1_03._array = (remove_const_t<decltype(_assigned)> *)_Var32._M_current;
                  __it2_03._iter._M_current = _Var43._M_current;
                  __it2_03._array = &pAVar38->_assigned;
                  bVar17 = __gnu_cxx::__ops::
                           _Iter_comp_iter<packing::overloadAndRemove(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                           ::operator()(&local_f8,__it1_03,__it2_03);
                  __it1_04._iter._M_current = _Var50._M_current;
                  __it1_04._array = (remove_const_t<decltype(_assigned)> *)_Var46._M_current;
                  __it2_04._iter._M_current = _Var43._M_current;
                  __it2_04._array = &pAVar38->_assigned;
                  bVar18 = __gnu_cxx::__ops::
                           _Iter_comp_iter<packing::overloadAndRemove(std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&)::$_0>
                           ::operator()(&local_f8,__it1_04,__it2_04);
                  if (bVar17) {
                    local_150 = pAVar45;
                    _Var37._M_current = _Var32._M_current;
                  }
                  if (!bVar18) {
                    _Var50._M_current = _Var46._M_current;
                    local_108 = pAVar45;
                  }
                }
                for (_Var32._M_current = (optional<packing::ProtoPalAttrs> *)(p_Var33 + 2);
                    ((_Optional_payload_base<packing::ProtoPalAttrs> *)_Var32._M_current !=
                     (_Optional_payload_base<packing::ProtoPalAttrs> *)
                     (pAVar45->_assigned).
                     super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish &&
                    (((_Optional_payload_base<packing::ProtoPalAttrs> *)_Var32._M_current)->
                     _M_engaged == false));
                    _Var32._M_current =
                         (optional<packing::ProtoPalAttrs> *)
                         ((_Optional_payload_base<packing::ProtoPalAttrs> *)_Var32._M_current + 1))
                {
                }
                pAVar38 = pAVar45;
                _Var36._M_current = _Var37._M_current;
                p_Var33 = local_178;
                pAVar27 = local_150;
                pAVar15 = local_108;
              } while ((_Optional_payload_base<packing::ProtoPalAttrs> *)_Var32._M_current !=
                       local_178);
            }
          }
        }
        if (((_Optional_payload_base<packing::ProtoPalAttrs> *)_Var50._M_current)->_M_engaged ==
            false) goto LAB_00108677;
        pPVar31 = (ProtoPalette *)
                  ((((_Optional_base<packing::ProtoPalAttrs,_false,_false> *)&local_180->_array)->
                   _M_payload).super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
                   super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload._M_value.
                   protoPalIndex +
                  (((_Optional_payload<packing::ProtoPalAttrs,_false,_false,_false> *)
                   &(((_Optional_payload_base<packing::ProtoPalAttrs> *)_Var50._M_current)->
                    _M_payload)._M_value.protoPalIndex)->
                  super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>).
                  super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload._M_value.
                  protoPalIndex * 8);
        sVar19 = ProtoPalette::size(pPVar31);
        local_178 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                    AssignedProtos::relSizeOf
                              ((AssignedProtos *)
                               local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                               pPVar31);
        auVar57._8_4_ = (int)(sVar19 >> 0x20);
        auVar57._0_8_ = sVar19;
        auVar57._12_4_ = 0x45300000;
        local_108 = (AssignedProtos *)
                    ((double)CONCAT44(0x43300000,(int)sVar19) - 4503599627370496.0);
        dStack_100 = auVar57._8_8_ - 1.9342813113834067e+25;
        if (((_Optional_payload_base<packing::ProtoPalAttrs> *)_Var37._M_current)->_M_engaged ==
            false) goto LAB_00108677;
        pPVar31 = (ProtoPalette *)
                  ((((_Optional_base<packing::ProtoPalAttrs,_false,_false> *)&local_180->_array)->
                   _M_payload).super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
                   super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload._M_value.
                   protoPalIndex +
                  (((_Optional_payload_base<packing::ProtoPalAttrs> *)_Var37._M_current)->_M_payload
                  )._M_value.protoPalIndex * 8);
        sVar19 = ProtoPalette::size(pPVar31);
        dVar58 = AssignedProtos::relSizeOf
                           ((AssignedProtos *)
                            local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,pPVar31)
        ;
        dStack_170 = dStack_100;
        auVar59._8_4_ = (int)(sVar19 >> 0x20);
        auVar59._0_8_ = sVar19;
        auVar59._12_4_ = 0x45300000;
        local_178 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                    ((dStack_100 + (double)local_108) / (double)local_178 -
                    ((auVar59._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)sVar19) - 4503599627370496.0)) / dVar58);
        if ((double)local_178 < 0.001) break;
        if (((_Optional_payload_base<packing::ProtoPalAttrs> *)_Var37._M_current)->_M_engaged ==
            false) goto LAB_00108677;
        std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>::
        emplace_back<packing::ProtoPalAttrs>
                  ((deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_> *)
                   &local_90,(ProtoPalAttrs *)_Var37._M_current);
        pPVar35 = local_90._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_90._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_90._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pPVar35 = local_90._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
        }
        ProtoPalAttrs::banFrom(pPVar35 + -1,(size_t)local_158);
        std::_Optional_payload_base<packing::ProtoPalAttrs>::_M_reset
                  ((_Optional_payload_base<packing::ProtoPalAttrs> *)_Var37._M_current);
      } while (0.001 <= (double)local_178);
    }
    std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>::pop_front
              ((deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_> *)&local_90);
  }
  if (local_198.
      super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_198.
      super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    p_Var33 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
              local_198.
              super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      puVar20 = AssignedProtos::uniqueColors((AssignedProtos *)p_Var33);
      if ((ulong)(byte)(options.nbColorsPerPal - options.hasTransparentPixels) <
          (puVar20->_M_h)._M_element_count) {
        pPVar4 = (ProtoPalAttrs *)
                 (p_Var33->_M_payload)._M_value.bannedPages.
                 super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                 _M_start.super__Bit_iterator_base._M_p;
        for (__args = (ProtoPalAttrs *)
                      (((_Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                         *)&(p_Var33->_M_payload)._M_value.protoPalIndex)->_M_impl).
                      super__Vector_impl_data._M_start;
            (__args != pPVar4 && (*(bool *)&__args[1].protoPalIndex == false));
            __args = (ProtoPalAttrs *)&__args[1].bannedPages) {
        }
LAB_00107930:
        if (__args != pPVar4) {
          if ((char)__args[1].protoPalIndex == '\0') goto LAB_00108677;
          std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>::
          emplace_back<packing::ProtoPalAttrs>
                    ((deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_> *)
                     &local_90,__args);
          pPVar47 = __args;
          do {
            __args = (ProtoPalAttrs *)&pPVar47[1].bannedPages;
            if (__args == (ProtoPalAttrs *)
                          (p_Var33->_M_payload)._M_value.bannedPages.
                          super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) break;
            pPVar9 = pPVar47 + 2;
            pPVar47 = __args;
          } while (*(char *)&(pPVar9->bannedPages).super__Bvector_base<std::allocator<bool>_>.
                             _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   == '\0');
          goto LAB_00107930;
        }
        p_Var49 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                  (((_Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                     *)&(p_Var33->_M_payload)._M_value.protoPalIndex)->_M_impl).
                  super__Vector_impl_data._M_start;
        p_Var34 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                  (p_Var33->_M_payload)._M_value.bannedPages.
                  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_start.super__Bit_iterator_base._M_p;
        p_Var48 = p_Var49;
        if (p_Var34 != p_Var49) {
          do {
            std::_Optional_payload_base<packing::ProtoPalAttrs>::_M_reset(p_Var48);
            p_Var48 = p_Var48 + 1;
          } while (p_Var48 != p_Var34);
          (p_Var33->_M_payload)._M_value.bannedPages.super__Bvector_base<std::allocator<bool>_>.
          _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
               (_Bit_type *)p_Var49;
        }
      }
      p_Var33 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                ((long)&(p_Var33->_M_payload)._M_value.bannedPages.
                        super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                        _M_finish.super__Bit_iterator_base + 8);
    } while (p_Var33 != (_Optional_payload_base<packing::ProtoPalAttrs> *)pAVar11);
  }
  do {
    pPVar35 = local_90._M_impl.super__Deque_impl_data._M_start._M_cur;
    pAVar11 = local_198.
              super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (local_90._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_90._M_impl.super__Deque_impl_data._M_start._M_cur) {
      if ((2 < options.verbosity) &&
         (local_178 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                      local_198.
                      super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
         p_Var33 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                   local_198.
                   super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                   ._M_impl.super__Vector_impl_data._M_start,
         local_198.
         super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
         _M_impl.super__Vector_impl_data._M_start !=
         local_198.
         super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
         _M_impl.super__Vector_impl_data._M_finish)) {
        do {
          fwrite("{ ",2,1,_stderr);
          plVar5 = (long *)(p_Var33->_M_payload)._M_value.bannedPages.
                           super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          for (plVar41 = *(long **)&p_Var33->_M_payload;
              (pFVar8 = _stderr, plVar41 != plVar5 && ((char)plVar41[6] == '\0'));
              plVar41 = plVar41 + 7) {
          }
joined_r0x00107b55:
          _stderr = pFVar8;
          if (plVar41 != plVar5) {
            if ((char)plVar41[6] == '\0') goto LAB_00108677;
            fprintf(pFVar8,"[%zu] ",*plVar41);
            pPVar31 = (ProtoPalette *)
                      ((((_Optional_base<packing::ProtoPalAttrs,_false,_false> *)&local_180->_array)
                       ->_M_payload).
                       super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
                       super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload._M_value.
                       protoPalIndex + *plVar41 * 8);
            puVar21 = ProtoPalette::begin(pPVar31);
            pvVar22 = ProtoPalette::end(pPVar31);
            for (; puVar21 != pvVar22; puVar21 = puVar21 + 1) {
              fprintf(_stderr,"%04x, ",(ulong)*puVar21);
            }
            plVar42 = plVar41;
            do {
              plVar41 = plVar42 + 7;
              pFVar8 = _stderr;
              if ((_Bit_type *)plVar41 ==
                  (p_Var33->_M_payload)._M_value.bannedPages.
                  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_start.super__Bit_iterator_base._M_p) break;
              plVar1 = plVar42 + 0xd;
              plVar42 = plVar41;
            } while ((char)*plVar1 == '\0');
            goto joined_r0x00107b55;
          }
          puVar20 = AssignedProtos::uniqueColors((AssignedProtos *)p_Var33);
          fprintf(pFVar8,"} (volume = %zu)\n",(puVar20->_M_h)._M_element_count);
          p_Var33 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                    ((long)&(p_Var33->_M_payload)._M_value.bannedPages.
                            super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8);
        } while (p_Var33 != local_178);
      }
      Options::verbosePrint
                (&options,'\x04',"%zu palettes before decanting\n",
                 (long)local_198.
                       super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_198.
                       super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
      uVar40 = (long)local_198.
                     super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_198.
                     super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      while (uVar40 = uVar40 - 1, uVar40 != 0) {
        lVar53 = uVar40 * 0x20;
        uVar30 = 0;
        do {
          local_f8._M_impl.super__Deque_impl_data._M_map_size =
               *(long *)((long)local_198.
                               super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar53 + 8);
          for (pIVar51 = (Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                          *)(((AssignedProtos *)
                             ((long)local_198.
                                    super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar53))->_assigned)
                            .
                            super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
              (pIVar51 !=
               (Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                *)local_f8._M_impl.super__Deque_impl_data._M_map_size &&
              (*(bool *)&pIVar51[3]._array == false));
              pIVar51 = (Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>,_std::remove_const_t>
                         *)&pIVar51[3]._iter) {
          }
          pAVar27 = (AssignedProtos *)
                    ((long)&(local_198.
                             super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_assigned + uVar30 * 0x20);
          pAVar38 = (AssignedProtos *)
                    ((long)local_198.
                           super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar53);
          local_f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)pAVar38;
          pAVar45 = (AssignedProtos *)AssignedProtos::uniqueColors(pAVar27);
          iter._iter._M_current = (optional<packing::ProtoPalAttrs> *)&local_f8;
          iter._array = (remove_const_t<decltype(_assigned)> *)pIVar51;
          AssignedProtos::
          addUniqueColors<packing::AssignedProtos::Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>*,std::vector<std::optional<packing::ProtoPalAttrs>,std::allocator<std::optional<packing::ProtoPalAttrs>>>>,std::remove_const_t>>
                    (pAVar45,(unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
                              *)pAVar38,iter,local_180,in_R9);
          if (pAVar45->_protoPals <=
              (vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)
              (ulong)(byte)(options.nbColorsPerPal - options.hasTransparentPixels)) {
            poVar24 = (pAVar38->_assigned).
                      super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            poVar55 = (pAVar38->_assigned).
                      super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            while ((poVar24 != poVar55 &&
                   ((poVar24->super__Optional_base<packing::ProtoPalAttrs,_false,_false>)._M_payload
                    .super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
                    super__Optional_payload_base<packing::ProtoPalAttrs>._M_engaged == false))) {
              poVar24 = poVar24 + 1;
            }
LAB_00107d4d:
            if (poVar24 != poVar55) {
              if ((poVar24->super__Optional_base<packing::ProtoPalAttrs,_false,_false>)._M_payload.
                  super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
                  super__Optional_payload_base<packing::ProtoPalAttrs>._M_engaged == false)
              goto LAB_00108677;
              AssignedProtos::assign<unsigned_long_const&>(pAVar27,(unsigned_long *)poVar24);
              poVar52 = poVar24;
              do {
                poVar24 = poVar52 + 1;
                if (poVar24 ==
                    (pAVar38->_assigned).
                    super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) break;
                poVar54 = poVar52 + 1;
                poVar52 = poVar24;
              } while ((poVar54->super__Optional_base<packing::ProtoPalAttrs,_false,_false>).
                       _M_payload.
                       super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
                       super__Optional_payload_base<packing::ProtoPalAttrs>._M_engaged == false);
              goto LAB_00107d4d;
            }
            p_Var33 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                      (pAVar38->_assigned).
                      super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            p_Var49 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                      (pAVar38->_assigned).
                      super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            p_Var34 = p_Var33;
            if (p_Var49 != p_Var33) {
              do {
                std::_Optional_payload_base<packing::ProtoPalAttrs>::_M_reset(p_Var34);
                p_Var34 = p_Var34 + 1;
              } while (p_Var34 != p_Var49);
              (pAVar38->_assigned).
              super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var33;
            }
          }
          pAVar11 = local_198.
                    super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar30 = uVar30 + 1;
        } while (uVar30 < uVar40);
        _Var23 = std::
                 __find_if<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>const*,std::vector<std::optional<packing::ProtoPalAttrs>,std::allocator<std::optional<packing::ProtoPalAttrs>>>>,__gnu_cxx::__ops::_Iter_pred<packing::AssignedProtos::empty()const::_lambda(std::optional<packing::ProtoPalAttrs>const&)_1_>>
                           ((((AssignedProtos *)
                             ((long)local_198.
                                    super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar53))->_assigned)
                            .
                            super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            *(undefined8 *)
                             ((long)local_198.
                                    super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar53 + 8));
        if (_Var23._M_current == *(optional<packing::ProtoPalAttrs> **)((long)pAVar11 + lVar53 + 8))
        {
          std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>::_M_erase
                    (&local_198,
                     (AssignedProtos *)
                     (lVar53 + (long)local_198.
                                     super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                                     ._M_impl.super__Vector_impl_data._M_start));
        }
      }
      Options::verbosePrint
                (&options,'\x04',"%zu palettes after decanting on palettes\n",
                 (long)local_198.
                       super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_198.
                       super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
      for (pAVar45 = (AssignedProtos *)
                     (((long)local_198.
                             super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_198.
                             super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5) + -1);
          pAVar45 != (AssignedProtos *)0x0;
          pAVar45 = (AssignedProtos *)((long)&pAVar45[-1]._protoPals + 7)) {
        pAVar38 = (AssignedProtos *)((long)pAVar45 << 5);
        pAVar27 = (AssignedProtos *)0x0;
        local_158 = pAVar38;
        local_150 = pAVar45;
        do {
          local_178 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                      local_198.
                      super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          pAVar45 = (AssignedProtos *)
                    ((long)&(pAVar38->_assigned).
                            super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                    (long)&(local_198.
                            super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_assigned);
          sVar19 = AssignedProtos::nbProtoPals(pAVar45);
          local_f8._M_impl.super__Deque_impl_data._M_map =
               (_Map_pointer)
               ((ulong)local_f8._M_impl.super__Deque_impl_data._M_map & 0xffffffffffffff00);
          std::vector<bool,_std::allocator<bool>_>::vector
                    (&local_130,sVar19,(bool *)&local_f8,(allocator_type *)&local_148);
          local_178 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                      ((long)&local_178->_M_payload + (long)pAVar27 * 0x20);
          local_f8._M_impl.super__Deque_impl_data._M_map =
               &local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          local_f8._M_impl.super__Deque_impl_data._M_map_size = 1;
          local_f8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
          local_f8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
          local_f8._M_impl.super__Deque_impl_data._M_start._M_last =
               (_Elt_pointer)
               CONCAT44(local_f8._M_impl.super__Deque_impl_data._M_start._M_last._4_4_,0x3f800000);
          local_f8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
          local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
          local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
          local_108 = pAVar27;
          while( true ) {
            local_160._M_cur._0_1_ = 1;
            _Var60 = std::
                     __find_if<std::_Bit_iterator,__gnu_cxx::__ops::_Iter_equals_val<bool_const>>
                               (local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,0,
                                local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p,
                                local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                _M_offset,&local_160);
            pAVar27 = local_108;
            pAVar38 = local_158;
            poVar24 = (pointer)_Var60.super__Bit_iterator_base._M_p;
            uVar29 = _Var60.super__Bit_iterator_base._M_offset;
            if ((poVar24 ==
                 (pointer)local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) &&
               (uVar29 == local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset))
            break;
            poVar55 = (pAVar45->_assigned).
                      super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            poVar52 = (pAVar45->_assigned).
                      super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            while ((poVar55 != poVar52 &&
                   ((poVar55->super__Optional_base<packing::ProtoPalAttrs,_false,_false>)._M_payload
                    .super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
                    super__Optional_payload_base<packing::ProtoPalAttrs>._M_engaged == false))) {
              poVar55 = poVar55 + 1;
            }
            for (lVar53 = (ulong)uVar29 +
                          ((long)poVar24 -
                          (long)local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8
                ; poVar54 = poVar55,
                pPVar35 = local_f8._M_impl.super__Deque_impl_data._M_start._M_cur, lVar53 != 0;
                lVar53 = lVar53 + -1) {
              do {
                poVar55 = poVar54 + 1;
                if (poVar55 == poVar52) break;
                poVar10 = poVar54 + 1;
                poVar54 = poVar55;
              } while ((poVar10->super__Optional_base<packing::ProtoPalAttrs,_false,_false>).
                       _M_payload.
                       super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
                       super__Optional_payload_base<packing::ProtoPalAttrs>._M_engaged == false);
            }
            while (pPVar35 != (_Elt_pointer)0x0) {
              pPVar6 = (_Elt_pointer)pPVar35->protoPalIndex;
              operator_delete(pPVar35,0x10);
              pPVar35 = pPVar6;
            }
            __position_00._M_current = (unsigned_long *)0x0;
            memset(local_f8._M_impl.super__Deque_impl_data._M_map,0,
                   local_f8._M_impl.super__Deque_impl_data._M_map_size << 3);
            local_f8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
            local_f8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
            if (local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start) {
              local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
            }
            if (local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start !=
                local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              __assert_fail("members.empty()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/pal_packing.cpp"
                            ,0x133,
                            "auto packing::decant(std::vector<AssignedProtos> &, const std::vector<ProtoPalette> &)::(anonymous class)::operator()(AssignedProtos &, AssignedProtos &) const"
                           );
            }
            do {
              pPVar35 = local_f8._M_impl.super__Deque_impl_data._M_start._M_cur;
              if ((poVar55->super__Optional_base<packing::ProtoPalAttrs,_false,_false>)._M_payload.
                  super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
                  super__Optional_payload_base<packing::ProtoPalAttrs>._M_engaged == false)
              goto LAB_00108677;
              pPVar31 = (ProtoPalette *)
                        ((((_Optional_base<packing::ProtoPalAttrs,_false,_false> *)
                          &local_180->_array)->_M_payload).
                         super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
                         super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload._M_value.
                         protoPalIndex +
                        (poVar55->super__Optional_base<packing::ProtoPalAttrs,_false,_false>).
                        _M_payload.
                        super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
                        super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload._M_value.
                        protoPalIndex * 8);
              if (local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start ==
                  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
LAB_0010803c:
                pvVar22 = ProtoPalette::begin(pPVar31);
                pvVar25 = ProtoPalette::end(pPVar31);
                local_160._M_cur = (__node_type *)&local_f8;
                __position_00._M_current =
                     local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                for (; local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish = __position_00._M_current,
                    pvVar22 != pvVar25; pvVar22 = pvVar22 + 1) {
                  std::
                  _Hashtable<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  ::
                  _M_insert<unsigned_short_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_short,false>>>>
                            ((_Hashtable<unsigned_short,unsigned_short,std::allocator<unsigned_short>,std::__detail::_Identity,std::equal_to<unsigned_short>,std::hash<unsigned_short>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                              *)&local_f8,pvVar22,&local_160);
                  __position_00._M_current =
                       local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                }
                local_160._M_cur =
                     (__node_type *)
                     ((ulong)uVar29 +
                     ((long)poVar24 -
                     (long)local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8);
                if (__position_00._M_current ==
                    local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                  _M_realloc_insert<unsigned_long>
                            (&local_148,__position_00,(unsigned_long *)&local_160);
                }
                else {
                  *__position_00._M_current = (unsigned_long)local_160._M_cur;
                  __position_00._M_current = __position_00._M_current + 1;
                  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish = __position_00._M_current;
                }
                (poVar24->super__Optional_base<packing::ProtoPalAttrs,_false,_false>)._M_payload.
                super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
                super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload._M_value.
                protoPalIndex =
                     (poVar24->super__Optional_base<packing::ProtoPalAttrs,_false,_false>).
                     _M_payload.super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
                     super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload._M_value.
                     protoPalIndex | 1L << ((byte)uVar29 & 0x3f);
              }
              else {
                pvVar22 = ProtoPalette::begin(pPVar31);
                pvVar25 = ProtoPalette::end(pPVar31);
                if (pPVar35 != (_Elt_pointer)0x0) {
                  do {
                    bVar17 = pvVar22 == pvVar25;
                    if (pvVar22 != pvVar25) {
                      vVar2 = *pvVar22;
                      pvVar44 = pvVar22;
                      while (*(value_type_conflict2 *)
                              &(pPVar35->bannedPages).super__Bvector_base<std::allocator<bool>_>.
                               _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                               _M_p != vVar2) {
                        pvVar44 = pvVar44 + 1;
                        bVar17 = pvVar44 == pvVar25;
                        if (pvVar44 == pvVar25) goto LAB_00108023;
                        vVar2 = *pvVar44;
                      }
                      __position_00._M_current = &pPVar35->protoPalIndex;
                      bVar17 = false;
                    }
LAB_00108023:
                    if (!bVar17) goto LAB_00108033;
                    pPVar35 = (_Elt_pointer)pPVar35->protoPalIndex;
                  } while (pPVar35 != (_Elt_pointer)0x0);
                  __position_00._M_current = (unsigned_long *)0x0;
LAB_00108033:
                  if ((_Elt_pointer)__position_00._M_current != (_Elt_pointer)0x0)
                  goto LAB_0010803c;
                }
              }
              bVar17 = uVar29 == 0x3f;
              uVar29 = uVar29 + 1;
              if (bVar17) {
                uVar29 = 0;
              }
              poVar52 = poVar55;
              do {
                poVar55 = poVar52 + 1;
                if (poVar55 ==
                    (pAVar45->_assigned).
                    super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) break;
                poVar54 = poVar52 + 1;
                poVar52 = poVar55;
              } while ((poVar54->super__Optional_base<packing::ProtoPalAttrs,_false,_false>).
                       _M_payload.
                       super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
                       super__Optional_payload_base<packing::ProtoPalAttrs>._M_engaged == false);
              poVar24 = (pointer)((long)&(poVar24->
                                         super__Optional_base<packing::ProtoPalAttrs,_false,_false>)
                                         ._M_payload.
                                         super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>
                                         .super__Optional_payload_base<packing::ProtoPalAttrs>.
                                         _M_payload + (ulong)bVar17 * 8);
            } while ((poVar24 !=
                      (pointer)local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p) ||
                    (uVar29 != local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset
                    ));
            local_160._M_cur =
                 (__node_type *)local_f8._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_38._M_cur = (__node_type *)0x0;
            sVar26 = AssignedProtos::
                     combinedVolume<std::__detail::_Node_iterator<unsigned_short,true,false>>
                               ((AssignedProtos *)local_178,
                                (_Node_iterator<unsigned_short,_true,_false> *)&local_160,
                                (_Node_iterator<unsigned_short,_true,_false> *)&local_38);
            puVar13 = local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            if (sVar26 <= (byte)(options.nbColorsPerPal - options.hasTransparentPixels)) {
              for (p_Var33 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                             (pAVar45->_assigned).
                             super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  (p_Var33 !=
                   (_Optional_payload_base<packing::ProtoPalAttrs> *)
                   (pAVar45->_assigned).
                   super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish && (p_Var33->_M_engaged == false));
                  p_Var33 = p_Var33 + 1) {
              }
              if (local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                pPVar35 = (_Elt_pointer)
                          local_148.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start;
                uVar28 = 0;
                do {
                  uVar7 = pPVar35->protoPalIndex;
                  lVar53 = uVar7 - uVar28;
                  if (lVar53 != 0) {
                    p_Var49 = p_Var33;
LAB_001081c6:
                    do {
                      p_Var33 = p_Var49 + 1;
                      if (p_Var33 !=
                          (_Optional_payload_base<packing::ProtoPalAttrs> *)
                          (pAVar45->_assigned).
                          super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) {
                        p_Var34 = p_Var49 + 1;
                        p_Var49 = p_Var33;
                        if (p_Var34->_M_engaged == false) goto LAB_001081c6;
                      }
                      lVar53 = lVar53 + -1;
                      p_Var49 = p_Var33;
                    } while (lVar53 != 0);
                  }
                  if (p_Var33->_M_engaged == false) goto LAB_00108677;
                  AssignedProtos::assign<packing::ProtoPalAttrs>
                            ((AssignedProtos *)local_178,(ProtoPalAttrs *)p_Var33);
                  std::_Optional_payload_base<packing::ProtoPalAttrs>::_M_reset(p_Var33);
                  pPVar35 = (_Elt_pointer)&pPVar35->bannedPages;
                  uVar28 = uVar7;
                } while (pPVar35 != (_Elt_pointer)puVar13);
              }
            }
          }
          if ((_Elt_pointer)
              local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (_Elt_pointer)0x0) {
            operator_delete(local_148.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_148.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_148.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          std::
          _Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)&local_f8);
          pAVar45 = local_150;
          if ((AssignedProtos *)
              local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p != (AssignedProtos *)0x0) {
            operator_delete(local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                            (long)local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_end_of_storage -
                            (long)local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
            local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_offset = 0;
            local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_offset = 0;
            local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_end_of_storage = (_Bit_pointer)0x0;
          }
          pAVar11 = local_198.
                    super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pAVar27 = (AssignedProtos *)
                    ((long)&(pAVar27->_assigned).
                            super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1);
        } while (pAVar27 < pAVar45);
        _Var23 = std::
                 __find_if<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>const*,std::vector<std::optional<packing::ProtoPalAttrs>,std::allocator<std::optional<packing::ProtoPalAttrs>>>>,__gnu_cxx::__ops::_Iter_pred<packing::AssignedProtos::empty()const::_lambda(std::optional<packing::ProtoPalAttrs>const&)_1_>>
                           (*(undefined8 *)
                             ((long)&(pAVar38->_assigned).
                                     super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start +
                             (long)&(local_198.
                                     super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_assigned),
                            *(undefined8 *)
                             ((undefined1 *)
                              ((long)&(local_198.
                                       super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_assigned + 8) +
                             (long)pAVar38));
        if (_Var23._M_current ==
            *(optional<packing::ProtoPalAttrs> **)
             ((long)&pAVar11->_assigned +
             (long)&(pAVar38->_assigned).
                    super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)) {
          std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>::_M_erase
                    (&local_198,
                     (AssignedProtos *)
                     ((long)&(local_198.
                              super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_assigned +
                     (long)&pAVar38->_assigned));
        }
      }
      Options::verbosePrint
                (&options,'\x04',"%zu palettes after decanting on \"components\"\n",
                 (long)local_198.
                       super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_198.
                       super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
      uVar40 = (long)local_198.
                     super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_198.
                     super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      while (uVar40 = uVar40 - 1, uVar40 != 0) {
        lVar53 = uVar40 * 0x20;
        uVar30 = 0;
        do {
          pAVar11 = local_198.
                    super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          p_Var49 = *(_Optional_payload_base<packing::ProtoPalAttrs> **)
                     ((long)local_198.
                            super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar53 + 8);
          for (p_Var33 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                         (((AssignedProtos *)
                          ((long)local_198.
                                 super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar53))->_assigned).
                         super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              (p_Var33 != p_Var49 && (p_Var33->_M_engaged == false)); p_Var33 = p_Var33 + 1) {
          }
          if (p_Var33 != p_Var49) {
            pAVar45 = (AssignedProtos *)
                      ((long)&(local_198.
                               super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_assigned + uVar30 * 0x20
                      );
            do {
              if (p_Var33->_M_engaged == false) goto LAB_00108677;
              bVar17 = AssignedProtos::canFit
                                 (pAVar45,(ProtoPalette *)
                                          ((((_Optional_base<packing::ProtoPalAttrs,_false,_false> *
                                             )&local_180->_array)->_M_payload).
                                           super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>
                                           .super__Optional_payload_base<packing::ProtoPalAttrs>.
                                           _M_payload._M_value.protoPalIndex +
                                          (p_Var33->_M_payload)._M_value.protoPalIndex * 8));
              if (bVar17) {
                if (p_Var33->_M_engaged == false) goto LAB_00108677;
                AssignedProtos::assign<packing::ProtoPalAttrs>(pAVar45,(ProtoPalAttrs *)p_Var33);
                std::_Optional_payload_base<packing::ProtoPalAttrs>::_M_reset(p_Var33);
              }
              p_Var49 = *(_Optional_payload_base<packing::ProtoPalAttrs> **)
                         ((long)pAVar11 + lVar53 + 8);
              p_Var34 = p_Var33;
              do {
                p_Var33 = p_Var34 + 1;
                if (p_Var33 == p_Var49) break;
                p_Var48 = p_Var34 + 1;
                p_Var34 = p_Var33;
              } while (p_Var48->_M_engaged == false);
            } while (p_Var33 != p_Var49);
          }
          pAVar11 = local_198.
                    super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar30 = uVar30 + 1;
        } while (uVar30 < uVar40);
        _Var23 = std::
                 __find_if<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>const*,std::vector<std::optional<packing::ProtoPalAttrs>,std::allocator<std::optional<packing::ProtoPalAttrs>>>>,__gnu_cxx::__ops::_Iter_pred<packing::AssignedProtos::empty()const::_lambda(std::optional<packing::ProtoPalAttrs>const&)_1_>>
                           ((((AssignedProtos *)
                             ((long)local_198.
                                    super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar53))->_assigned)
                            .
                            super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            *(undefined8 *)
                             ((long)local_198.
                                    super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar53 + 8));
        if (_Var23._M_current == *(optional<packing::ProtoPalAttrs> **)((long)pAVar11 + lVar53 + 8))
        {
          std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>::_M_erase
                    (&local_198,
                     (AssignedProtos *)
                     (lVar53 + (long)local_198.
                                     super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                                     ._M_impl.super__Vector_impl_data._M_start));
        }
      }
      Options::verbosePrint
                (&options,'\x04',"%zu palettes after decanting on proto-palettes\n",
                 (long)local_198.
                       super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_198.
                       super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
      if ((2 < options.verbosity) &&
         (local_178 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                      local_198.
                      super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
         p_Var33 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                   local_198.
                   super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                   ._M_impl.super__Vector_impl_data._M_start,
         local_198.
         super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
         _M_impl.super__Vector_impl_data._M_start !=
         local_198.
         super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
         _M_impl.super__Vector_impl_data._M_finish)) {
        do {
          fwrite("{ ",2,1,_stderr);
          plVar5 = (long *)(p_Var33->_M_payload)._M_value.bannedPages.
                           super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          for (plVar41 = *(long **)&p_Var33->_M_payload;
              (pFVar8 = _stderr, plVar41 != plVar5 && ((char)plVar41[6] == '\0'));
              plVar41 = plVar41 + 7) {
          }
joined_r0x00108471:
          _stderr = pFVar8;
          if (plVar41 != plVar5) {
            if ((char)plVar41[6] == '\0') goto LAB_00108677;
            fprintf(pFVar8,"[%zu] ",*plVar41);
            pPVar31 = (ProtoPalette *)
                      ((((_Optional_base<packing::ProtoPalAttrs,_false,_false> *)&local_180->_array)
                       ->_M_payload).
                       super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
                       super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload._M_value.
                       protoPalIndex + *plVar41 * 8);
            puVar21 = ProtoPalette::begin(pPVar31);
            pvVar22 = ProtoPalette::end(pPVar31);
            for (; puVar21 != pvVar22; puVar21 = puVar21 + 1) {
              fprintf(_stderr,"%04x, ",(ulong)*puVar21);
            }
            plVar42 = plVar41;
            do {
              plVar41 = plVar42 + 7;
              pFVar8 = _stderr;
              if ((_Bit_type *)plVar41 ==
                  (p_Var33->_M_payload)._M_value.bannedPages.
                  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                  _M_start.super__Bit_iterator_base._M_p) break;
              plVar1 = plVar42 + 0xd;
              plVar42 = plVar41;
            } while ((char)*plVar1 == '\0');
            goto joined_r0x00108471;
          }
          puVar20 = AssignedProtos::uniqueColors((AssignedProtos *)p_Var33);
          fprintf(pFVar8,"} (volume = %zu)\n",(puVar20->_M_h)._M_element_count);
          p_Var33 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                    ((long)&(p_Var33->_M_payload)._M_value.bannedPages.
                            super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8);
        } while (p_Var33 != local_178);
      }
      std::
      vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::vector((vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                *)&local_f8,
               (long)((long)(local_180->_iter)._M_current -
                     (((_Optional_base<packing::ProtoPalAttrs,_false,_false> *)&local_180->_array)->
                     _M_payload).super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>
                     .super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload._M_value.
                     protoPalIndex) >> 3,(allocator_type *)&local_130);
      ptVar14 = local_40;
      uVar28 = (long)local_198.
                     super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_198.
                     super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      if (local_198.
          super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_198.
          super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        p_Var39 = (_Hash_node_base *)0x0;
        do {
          plVar5 = *(long **)((long)&(local_198.
                                      super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_assigned +
                             (long)p_Var39 * 0x20 + 8);
          for (plVar41 = *(long **)((long)&(local_198.
                                            super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_assigned +
                                   (long)p_Var39 * 0x20);
              (plVar41 != plVar5 && ((char)plVar41[6] == '\0')); plVar41 = plVar41 + 7) {
          }
joined_r0x001085c6:
          if (plVar41 != plVar5) {
            if ((char)plVar41[6] == '\0') {
LAB_00108677:
              __assert_fail("(*_iter).has_value()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/pal_packing.cpp"
                            ,0x72,
                            "reference packing::AssignedProtos::Iter<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs> *, std::vector<std::optional<packing::ProtoPalAttrs>>>, std::remove_const_t>::operator*() const [Inner = __gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs> *, std::vector<std::optional<packing::ProtoPalAttrs>>>, Constness = std::remove_const_t]"
                           );
            }
            ((_Hash_node_base *)(local_f8._M_impl.super__Deque_impl_data._M_map + *plVar41))->_M_nxt
                 = p_Var39;
            plVar42 = plVar41;
            do {
              plVar41 = plVar42 + 7;
              if (plVar41 == plVar5) break;
              plVar1 = plVar42 + 0xd;
              plVar42 = plVar41;
            } while ((char)*plVar1 == '\0');
            goto joined_r0x001085c6;
          }
          p_Var39 = (_Hash_node_base *)((long)&p_Var39->_M_nxt + 1);
        } while (p_Var39 != (_Hash_node_base *)(uVar28 + (uVar28 == 0)));
      }
      (local_40->
      super__Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
      ).super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>.
      _M_head_impl = uVar28;
      std::
      vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::vector(&(local_40->
                super__Tuple_impl<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                ).
                super__Head_base<0UL,_std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                ._M_head_impl,
               (vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                *)&local_f8);
      if ((AssignedProtos *)local_f8._M_impl.super__Deque_impl_data._M_map != (AssignedProtos *)0x0)
      {
        operator_delete(local_f8._M_impl.super__Deque_impl_data._M_map,
                        (long)local_f8._M_impl.super__Deque_impl_data._M_start._M_cur -
                        (long)local_f8._M_impl.super__Deque_impl_data._M_map);
      }
      std::vector<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>::~vector
                (&local_198);
      std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>::~deque
                ((deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_> *)&local_90
                );
      if (local_a8.
          super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
        operator_delete(local_a8.
                        super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_a8.
                              super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.
                              super__Vector_base<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return ptVar14;
    }
    pPVar31 = (ProtoPalette *)
              ((((_Optional_base<packing::ProtoPalAttrs,_false,_false> *)&local_180->_array)->
               _M_payload).super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
               super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload._M_value.
               protoPalIndex +
              (local_90._M_impl.super__Deque_impl_data._M_start._M_cur)->protoPalIndex * 8);
    lVar53 = (long)local_198.
                   super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_198.
                   super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 7;
    p_Var33 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
              local_198.
              super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (0 < lVar53) {
      lVar53 = lVar53 + 1;
      do {
        bVar17 = AssignedProtos::canFit((AssignedProtos *)p_Var33,pPVar31);
        p_Var49 = p_Var33;
        if (bVar17) goto LAB_00107a4e;
        p_Var49 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                  ((long)&(p_Var33->_M_payload)._M_value.bannedPages.
                          super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8);
        bVar17 = AssignedProtos::canFit((AssignedProtos *)p_Var49,pPVar31);
        if (bVar17) goto LAB_00107a4e;
        p_Var49 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                  &p_Var33[1]._M_payload._M_value.bannedPages;
        bVar17 = AssignedProtos::canFit((AssignedProtos *)p_Var49,pPVar31);
        if (bVar17) goto LAB_00107a4e;
        p_Var49 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                  &p_Var33[1]._M_payload._M_value.bannedPages.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_end_of_storage;
        bVar17 = AssignedProtos::canFit((AssignedProtos *)p_Var49,pPVar31);
        if (bVar17) goto LAB_00107a4e;
        p_Var33 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                  ((long)&p_Var33[2]._M_payload._M_value.bannedPages.
                          super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base + 8);
        lVar53 = lVar53 + -1;
      } while (1 < lVar53);
    }
    lVar53 = (long)pAVar11 - (long)p_Var33 >> 5;
    if (lVar53 == 1) {
LAB_00107a3a:
      bVar17 = AssignedProtos::canFit((AssignedProtos *)p_Var33,pPVar31);
      p_Var49 = (_Optional_payload_base<packing::ProtoPalAttrs> *)pAVar11;
      if (bVar17) {
        p_Var49 = p_Var33;
      }
    }
    else if (lVar53 == 2) {
LAB_00107a22:
      bVar17 = AssignedProtos::canFit((AssignedProtos *)p_Var33,pPVar31);
      p_Var49 = p_Var33;
      if (!bVar17) {
        p_Var33 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                  ((long)&(p_Var33->_M_payload)._M_value.bannedPages.
                          super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8);
        goto LAB_00107a3a;
      }
    }
    else {
      p_Var49 = (_Optional_payload_base<packing::ProtoPalAttrs> *)pAVar11;
      if ((lVar53 == 3) &&
         (bVar17 = AssignedProtos::canFit((AssignedProtos *)p_Var33,pPVar31), p_Var49 = p_Var33,
         !bVar17)) {
        p_Var33 = (_Optional_payload_base<packing::ProtoPalAttrs> *)
                  ((long)&(p_Var33->_M_payload)._M_value.bannedPages.
                          super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8);
        goto LAB_00107a22;
      }
    }
LAB_00107a4e:
    if (p_Var49 ==
        (_Optional_payload_base<packing::ProtoPalAttrs> *)
        local_198.
        super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      Options::verbosePrint
                (&options,'\x04',"Adding new palette (%zu) for overflowing proto-pal %zu\n",
                 (long)local_198.
                       super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_198.
                       super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5,pPVar35->protoPalIndex);
      std::vector<packing::AssignedProtos,std::allocator<packing::AssignedProtos>>::
      emplace_back<std::vector<ProtoPalette,std::allocator<ProtoPalette>>const&,packing::ProtoPalAttrs_const>
                ((vector<packing::AssignedProtos,std::allocator<packing::AssignedProtos>> *)
                 &local_198,(vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)local_180,pPVar35
                );
    }
    else {
      Options::verbosePrint
                (&options,'\x04',"Assigning overflowing proto-pal %zu to palette %zu\n",
                 pPVar35->protoPalIndex,
                 (long)p_Var49 -
                 (long)local_198.
                       super__Vector_base<packing::AssignedProtos,_std::allocator<packing::AssignedProtos>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
      AssignedProtos::assign<packing::ProtoPalAttrs_const>((AssignedProtos *)p_Var49,pPVar35);
    }
    std::deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_>::pop_front
              ((deque<packing::ProtoPalAttrs,_std::allocator<packing::ProtoPalAttrs>_> *)&local_90);
  } while( true );
}

Assistant:

std::tuple<DefaultInitVec<size_t>, size_t>
    overloadAndRemove(std::vector<ProtoPalette> const &protoPalettes) {
	options.verbosePrint(Options::VERB_LOG_ACT,
	                     "Paginating palettes using \"overload-and-remove\" strategy...\n");

	// Sort the proto-palettes by size, which improves the packing algorithm's efficiency
	DefaultInitVec<size_t> sortedProtoPalIDs(protoPalettes.size());
	sortedProtoPalIDs.clear();
	for (size_t i = 0; i < protoPalettes.size(); ++i) {
		sortedProtoPalIDs.insert(
		    std::lower_bound(sortedProtoPalIDs.begin(), sortedProtoPalIDs.end(), i), i);
	}
	// Begin with all proto-palettes queued up for insertion
	std::queue<ProtoPalAttrs> queue(
	    std::deque<ProtoPalAttrs>(sortedProtoPalIDs.begin(), sortedProtoPalIDs.end()));
	// Begin with no pages
	std::vector<AssignedProtos> assignments{};

	for (; !queue.empty(); queue.pop()) {
		ProtoPalAttrs const &attrs = queue.front(); // Valid until the `queue.pop()`
		options.verbosePrint(Options::VERB_DEBUG, "Handling proto-pal %zu\n", attrs.protoPalIndex);

		ProtoPalette const &protoPal = protoPalettes[attrs.protoPalIndex];
		size_t bestPalIndex = assignments.size();
		// We're looking for a palette where the proto-palette's relative size is less than
		// its actual size; so only overwrite the "not found" index on meeting that criterion
		double bestRelSize = protoPal.size();

		for (size_t i = 0; i < assignments.size(); ++i) {
			// Skip the page if this one is banned from it
			if (attrs.isBannedFrom(i)) {
				continue;
			}

			options.verbosePrint(Options::VERB_DEBUG, "%zu/%zu: Rel size: %f (size = %zu)\n", i + 1,
			                     assignments.size(), assignments[i].relSizeOf(protoPal),
			                     protoPal.size());
			if (assignments[i].relSizeOf(protoPal) < bestRelSize) {
				bestPalIndex = i;
			}
		}

		if (bestPalIndex == assignments.size()) {
			// Found nowhere to put it, create a new page containing just that one
			assignments.emplace_back(protoPalettes, std::move(attrs));
		} else {
			auto &bestPal = assignments[bestPalIndex];
			// Add the color to that palette
			bestPal.assign(std::move(attrs));

			// If this overloads the palette, get it back to normal (if possible)
			while (bestPal.volume() > options.maxOpaqueColors()) {
				options.verbosePrint(Options::VERB_DEBUG,
				                     "Palette %zu is overloaded! (%zu > %" PRIu8 ")\n",
				                     bestPalIndex, bestPal.volume(), options.maxOpaqueColors());

				// Look for a proto-pal minimizing "efficiency" (size / rel_size)
				auto efficiency = [&bestPal](ProtoPalette const &pal) {
					return pal.size() / bestPal.relSizeOf(pal);
				};
				auto [minEfficiencyIter, maxEfficiencyIter] =
				    std::minmax_element(bestPal.begin(), bestPal.end(),
				                        [&efficiency, &protoPalettes](ProtoPalAttrs const &lhs,
				                                                      ProtoPalAttrs const &rhs) {
					                        return efficiency(protoPalettes[lhs.protoPalIndex])
					                               < efficiency(protoPalettes[rhs.protoPalIndex]);
				                        });

				// All efficiencies are identical iff min equals max
				// TODO: maybe not ideal to re-compute these two?
				// TODO: yikes for float comparison! I *think* this threshold is OK?
				if (efficiency(protoPalettes[maxEfficiencyIter->protoPalIndex])
				        - efficiency(protoPalettes[minEfficiencyIter->protoPalIndex])
				    < .001) {
					break;
				}

				// Remove the proto-pal with minimal efficiency
				queue.emplace(std::move(*minEfficiencyIter));
				queue.back().banFrom(bestPalIndex); // Ban it from this palette
				bestPal.remove(minEfficiencyIter);
			}
		}
	}

	// Deal with palettes still overloaded, by emptying them
	for (AssignedProtos &pal : assignments) {
		if (pal.volume() > options.maxOpaqueColors()) {
			for (ProtoPalAttrs &attrs : pal) {
				queue.emplace(std::move(attrs));
			}
			pal.clear();
		}
	}
	// Place back any proto-palettes now in the queue via first-fit
	while (!queue.empty()) {
		ProtoPalAttrs const &attrs = queue.front();
		ProtoPalette const &protoPal = protoPalettes[attrs.protoPalIndex];
		auto iter =
		    std::find_if(assignments.begin(), assignments.end(),
		                 [&protoPal](AssignedProtos const &pal) { return pal.canFit(protoPal); });
		if (iter == assignments.end()) { // No such page, create a new one
			options.verbosePrint(Options::VERB_DEBUG,
			                     "Adding new palette (%zu) for overflowing proto-pal %zu\n",
			                     assignments.size(), attrs.protoPalIndex);
			assignments.emplace_back(protoPalettes, std::move(attrs));
		} else {
			options.verbosePrint(Options::VERB_DEBUG,
			                     "Assigning overflowing proto-pal %zu to palette %zu\n",
			                     attrs.protoPalIndex, iter - assignments.begin());
			iter->assign(std::move(attrs));
		}
		queue.pop();
	}

	if (options.verbosity >= Options::VERB_INTERM) {
		for (auto &&assignment : assignments) {
			fprintf(stderr, "{ ");
			for (auto &&attrs : assignment) {
				fprintf(stderr, "[%zu] ", attrs.protoPalIndex);
				for (auto &&colorIndex : protoPalettes[attrs.protoPalIndex]) {
					fprintf(stderr, "%04" PRIx16 ", ", colorIndex);
				}
			}
			fprintf(stderr, "} (volume = %zu)\n", assignment.volume());
		}
	}

	// "Decant" the result
	decant(assignments, protoPalettes);
	// Note that the result does not contain any empty palettes

	if (options.verbosity >= Options::VERB_INTERM) {
		for (auto &&assignment : assignments) {
			fprintf(stderr, "{ ");
			for (auto &&attrs : assignment) {
				fprintf(stderr, "[%zu] ", attrs.protoPalIndex);
				for (auto &&colorIndex : protoPalettes[attrs.protoPalIndex]) {
					fprintf(stderr, "%04" PRIx16 ", ", colorIndex);
				}
			}
			fprintf(stderr, "} (volume = %zu)\n", assignment.volume());
		}
	}

	DefaultInitVec<size_t> mappings(protoPalettes.size());
	for (size_t i = 0; i < assignments.size(); ++i) {
		for (ProtoPalAttrs const &attrs : assignments[i]) {
			mappings[attrs.protoPalIndex] = i;
		}
	}
	return {mappings, assignments.size()};
}